

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O3

int lj_cf_ffi_istype(lua_State *L)

{
  TValue *pTVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  TValue *pTVar5;
  CType *pCVar6;
  CTypeID CVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  CTState *cts;
  bool bVar13;
  
  cts = (CTState *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0xfc);
  cts->L = L;
  CVar7 = ffi_checkctype(L,cts,(TValue *)0x0);
  pTVar5 = L->top;
  pTVar1 = L->base + 1;
  if (pTVar5 <= pTVar1) {
    lj_err_arg(L,2,LJ_ERR_NOVAL);
  }
  iVar10 = -2;
  if (*(int *)((long)L->base + 0xc) != -0xb) goto LAB_0014d05c;
  uVar11 = (ulong)(pTVar1->u32).lo;
  uVar2 = *(ushort *)(uVar11 + 6);
  uVar9 = (uint)uVar2;
  if (uVar2 == 0x15) {
    uVar9 = *(uint *)(uVar11 + 8);
  }
  pCVar6 = cts->tab;
  do {
    uVar8 = CVar7;
    uVar3 = pCVar6[uVar8].info;
    CVar7 = uVar3 & 0xffff;
  } while ((uVar3 & 0xf0800000) == 0x20800000);
  do {
    uVar12 = uVar9;
    uVar4 = pCVar6[uVar12].info;
    uVar9 = uVar4 & 0xffff;
  } while ((uVar4 & 0xf0800000) == 0x20800000);
  uVar9 = 1;
  if (uVar8 != uVar12) {
    if ((uVar3 >> 0x1c == uVar4 >> 0x1c) && (pCVar6[uVar8].size == pCVar6[uVar12].size)) {
      if ((uVar3 & 0xe0000000) == 0x20000000) {
        uVar9 = lj_cconv_compatptr(cts,pCVar6 + uVar8,pCVar6 + uVar12,8);
      }
      else {
        uVar9 = 0;
        if (uVar3 < 0x10000000 || uVar3 >> 0x1c == 4) {
          bVar13 = ((uVar4 ^ uVar3) & 0xfcbfffff) == 0;
          goto LAB_0014d052;
        }
      }
    }
    else {
      uVar9 = 0;
      if (((uVar3 & 0xf0000000) == 0x10000000) && (uVar9 = 0, (uVar4 & 0xf0000000) == 0x20000000)) {
        bVar13 = uVar8 == (uVar4 & 0xffff);
LAB_0014d052:
        uVar9 = (uint)bVar13;
      }
    }
  }
  iVar10 = -2 - uVar9;
LAB_0014d05c:
  *(int *)((long)pTVar5 - 4) = iVar10;
  *(int *)((ulong)(L->glref).ptr32 + 0xac) = iVar10;
  return 1;
}

Assistant:

LJLIB_CF(ffi_istype)	LJLIB_REC(.)
{
  CTState *cts = ctype_cts(L);
  CTypeID id1 = ffi_checkctype(L, cts, NULL);
  TValue *o = lj_lib_checkany(L, 2);
  int b = 0;
  if (tviscdata(o)) {
    GCcdata *cd = cdataV(o);
    CTypeID id2 = cd->ctypeid == CTID_CTYPEID ? *(CTypeID *)cdataptr(cd) :
						cd->ctypeid;
    CType *ct1 = lj_ctype_rawref(cts, id1);
    CType *ct2 = lj_ctype_rawref(cts, id2);
    if (ct1 == ct2) {
      b = 1;
    } else if (ctype_type(ct1->info) == ctype_type(ct2->info) &&
	       ct1->size == ct2->size) {
      if (ctype_ispointer(ct1->info))
	b = lj_cconv_compatptr(cts, ct1, ct2, CCF_IGNQUAL);
      else if (ctype_isnum(ct1->info) || ctype_isvoid(ct1->info))
	b = (((ct1->info ^ ct2->info) & ~(CTF_QUAL|CTF_LONG)) == 0);
    } else if (ctype_isstruct(ct1->info) && ctype_isptr(ct2->info) &&
	       ct1 == ctype_rawchild(cts, ct2)) {
      b = 1;
    }
  }
  setboolV(L->top-1, b);
  setboolV(&G(L)->tmptv2, b);  /* Remember for trace recorder. */
  return 1;
}